

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cpp
# Opt level: O0

shared_ptr<index_tree> __thiscall dfa::get_index_tree(dfa *this,wchar_t key)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  element_type *in_RDI;
  shared_ptr<index_tree> sVar3;
  iterator iter;
  unordered_map<wchar_t,_std::shared_ptr<index_tree>,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>_>_>
  *in_stack_ffffffffffffffb8;
  element_type *this_00;
  _Node_iterator_base<std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>,_false> local_28;
  _Node_iterator_base<std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>,_false> local_20 [4];
  
  this_00 = in_RDI;
  local_20[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<wchar_t,_std::shared_ptr<index_tree>,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>_>_>
       ::find(in_stack_ffffffffffffffb8,(key_type *)0x113703);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<wchar_t,_std::shared_ptr<index_tree>,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>_>_>
       ::end(in_stack_ffffffffffffffb8);
  bVar1 = std::__detail::operator!=(local_20,&local_28);
  if (bVar1) {
    std::__detail::
    _Node_iterator<std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>,_false,_false>::operator->
              ((_Node_iterator<std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>,_false,_false>
                *)0x113736);
    std::shared_ptr<index_tree>::shared_ptr
              ((shared_ptr<index_tree> *)this_00,(shared_ptr<index_tree> *)in_stack_ffffffffffffffb8
              );
    _Var2._M_pi = extraout_RDX;
  }
  else {
    std::shared_ptr<index_tree>::shared_ptr
              ((shared_ptr<index_tree> *)this_00,in_stack_ffffffffffffffb8);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<index_tree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<index_tree,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<index_tree>)sVar3.super___shared_ptr<index_tree,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<index_tree> dfa::get_index_tree(wchar_t key)
{
    auto iter = index_trees_.find(key);
    if (iter != index_trees_.end())
    {
        return iter->second;
    }
    return nullptr;
}